

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O0

bool __thiscall
OpenCLKernels::runKernelCalculateFilteredDiff
          (OpenCLKernels *this,UMat *src_diff,uint threshold_1,uint threshold_2,UMat *filtered_diff,
          string *error)

{
  bool bVar1;
  byte bVar2;
  Kernel *pKVar3;
  Queue local_d0 [8];
  KernelArg local_c8 [56];
  KernelArg local_90 [40];
  scoped_lock<std::mutex> local_68;
  scoped_lock<std::mutex> lock;
  undefined8 uStack_58;
  bool execution_result;
  size_t local_size [2];
  size_t global_size [2];
  string *error_local;
  UMat *filtered_diff_local;
  uint threshold_2_local;
  uint threshold_1_local;
  UMat *src_diff_local;
  OpenCLKernels *this_local;
  
  filtered_diff_local._0_4_ = threshold_2;
  filtered_diff_local._4_4_ = threshold_1;
  _threshold_2_local = src_diff;
  src_diff_local = (UMat *)this;
  bVar1 = isAvailable(this,error);
  if (bVar1) {
    local_size[1] = (size_t)*(int *)(_threshold_2_local + 0xc);
    uStack_58 = 0x10;
    local_size[0] = 0x10;
    std::scoped_lock<std::mutex>::scoped_lock(&local_68,&this->kernel_calculate_filtered_diff_guard)
    ;
    cv::ocl::KernelArg::ReadOnly(local_90,_threshold_2_local,1,1);
    cv::ocl::KernelArg::WriteOnlyNoSize(local_c8,filtered_diff,1,1);
    pKVar3 = cv::ocl::Kernel::args<cv::ocl::KernelArg,unsigned_int,unsigned_int,cv::ocl::KernelArg>
                       (&this->kernel_calculate_filtered_diff,local_90,
                        (uint *)((long)&filtered_diff_local + 4),(uint *)&filtered_diff_local,
                        local_c8);
    cv::ocl::Queue::Queue(local_d0);
    bVar2 = cv::ocl::Kernel::run
                      ((int)pKVar3,(ulong *)0x2,local_size + 1,SUB81(&stack0xffffffffffffffa8,0),
                       (Queue *)0x1);
    lock._M_device._7_1_ = bVar2 & 1;
    cv::ocl::Queue::~Queue(local_d0);
    std::scoped_lock<std::mutex>::~scoped_lock(&local_68);
    if ((lock._M_device._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)error,"OpenCL kernel: kernel_calculate_filtered_diff launch failed.");
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
OpenCLKernels::runKernelCalculateFilteredDiff(const UMat &src_diff, unsigned int threshold_1, unsigned int threshold_2,
                                              UMat &filtered_diff, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) src_diff.cols, (size_t) src_diff.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_calculate_filtered_diff_guard);
        execution_result = kernel_calculate_filtered_diff.args(
                cv::ocl::KernelArg::ReadOnly(src_diff),
                threshold_1,
                threshold_2,
                cv::ocl::KernelArg::WriteOnlyNoSize(filtered_diff)
        ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_calculate_filtered_diff launch failed.";
        return false;
    }

    return true;
}